

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator|=(CharClass<wchar_t> *this,CharClass<wchar_t> *cc)

{
  CharClass<wchar_t> local_30;
  
  operator|(&local_30,this,cc);
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
  _M_move_assign(&this->m_ranges,&local_30.m_ranges);
  ~CharClass(&local_30);
  return this;
}

Assistant:

CharClass<TCHAR>& operator|=(const CharClass<TCHAR>& cc)
    {
        return *this = *this | cc;
    }